

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadDirectionalLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  element_type *peVar1;
  pointer pcVar2;
  undefined8 *in_RDX;
  XMLLoader *this_00;
  string *childID;
  Vec3fa VVar3;
  Vec3fa E;
  AffineSpace3fa space;
  undefined1 local_a0 [8];
  undefined1 local_98 [34];
  undefined5 uStack_76;
  undefined4 uStack_71;
  undefined1 uStack_6d;
  undefined4 uStack_6c;
  _Alloc_hider local_68;
  undefined1 auStack_60 [8];
  AffineSpace3fa local_58;
  
  this_00 = (XMLLoader *)*in_RDX;
  peVar1 = (element_type *)(local_98 + 0x20);
  local_98._32_2_ = 0x6641;
  uStack_76 = 0x53656e6966;
  uStack_71 = 0x65636170;
  local_98._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
  uStack_6d = 0;
  local_98._16_8_ = peVar1;
  XML::child((XML *)local_98,(string *)this_00);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (&local_58,this_00,(Ref<embree::XML> *)local_98);
  if ((XML *)local_98._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_98._0_8_ + 0x18))();
  }
  if ((element_type *)local_98._16_8_ != peVar1) {
    operator_delete((void *)local_98._16_8_);
  }
  childID = (string *)*in_RDX;
  local_98._32_2_ = 0x45;
  local_98._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_98._16_8_ = peVar1;
  XML::child((XML *)local_a0,childID);
  VVar3 = load<embree::Vec3fa>((XMLLoader *)local_98,(Ref<embree::XML> *)childID);
  if (local_a0 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_a0 + 0x18))(VVar3.field_0._0_4_,VVar3.field_0._8_4_);
  }
  if ((element_type *)local_98._16_8_ != peVar1) {
    operator_delete((void *)local_98._16_8_);
  }
  local_98._16_8_ = (element_type *)0x0;
  local_98._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f800000;
  local_68._M_p = (pointer)local_98._0_8_;
  auStack_60 = (undefined1  [8])local_98._8_8_;
  local_98._32_2_ = (undefined2)local_98._0_8_;
  uStack_76 = SUB85(local_98._0_8_,2);
  uStack_71._0_1_ = SUB81(local_98._0_8_,7);
  uStack_71._1_3_ = (undefined3)local_98._8_8_;
  uStack_6d = SUB81(local_98._8_8_,3);
  uStack_6c = SUB84(local_98._8_8_,4);
  pcVar2 = (pointer)alignedMalloc(0xa0,0x10);
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  *(pointer *)(pcVar2 + 0x10) = pcVar2 + 0x20;
  pcVar2[0x18] = '\0';
  pcVar2[0x19] = '\0';
  pcVar2[0x1a] = '\0';
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[0x20] = '\0';
  *(pointer *)(pcVar2 + 0x30) = pcVar2 + 0x40;
  pcVar2[0x38] = '\0';
  pcVar2[0x39] = '\0';
  pcVar2[0x3a] = '\0';
  pcVar2[0x3b] = '\0';
  pcVar2[0x3c] = '\0';
  pcVar2[0x3d] = '\0';
  pcVar2[0x3e] = '\0';
  pcVar2[0x3f] = '\0';
  pcVar2[0x40] = '\0';
  pcVar2[0x50] = '\0';
  pcVar2[0x51] = '\0';
  pcVar2[0x52] = '\0';
  pcVar2[0x53] = '\0';
  pcVar2[0x54] = '\0';
  pcVar2[0x55] = '\0';
  pcVar2[0x56] = '\0';
  pcVar2[0x57] = '\0';
  pcVar2[0x58] = '\0';
  pcVar2[0x59] = '\0';
  pcVar2[0x5c] = -1;
  pcVar2[0x5d] = -1;
  pcVar2[0x5e] = -1;
  pcVar2[0x5f] = -1;
  pcVar2[0x60] = '\0';
  pcVar2[0x61] = '\0';
  pcVar2[0x62] = '\0';
  pcVar2[99] = '\0';
  pcVar2[100] = '\0';
  pcVar2[0x65] = '\0';
  pcVar2[0x66] = '\0';
  pcVar2[0x67] = '\0';
  *(undefined ***)pcVar2 = &PTR__Node_002ca978;
  pcVar2[0x70] = '\x02';
  pcVar2[0x71] = '\0';
  pcVar2[0x72] = '\0';
  pcVar2[0x73] = '\0';
  *(float *)(pcVar2 + 0x80) =
       (float)local_58.l.vx.field_0._0_4_ * 0.0 +
       (float)local_98._20_4_ * local_58.l.vy.field_0.m128[0] +
       (float)local_98._24_4_ * local_58.l.vz.field_0.m128[0];
  *(float *)(pcVar2 + 0x84) =
       (float)local_58.l.vx.field_0._4_4_ * 0.0 +
       (float)local_98._20_4_ * local_58.l.vy.field_0.m128[1] +
       (float)local_98._24_4_ * local_58.l.vz.field_0.m128[1];
  *(float *)(pcVar2 + 0x88) =
       (float)local_58.l.vx.field_0._8_4_ * 0.0 +
       (float)local_98._20_4_ * local_58.l.vy.field_0.m128[2] +
       (float)local_98._24_4_ * local_58.l.vz.field_0.m128[2];
  *(float *)(pcVar2 + 0x8c) =
       (float)local_58.l.vx.field_0._12_4_ * 0.0 +
       (float)local_98._20_4_ * local_58.l.vy.field_0.m128[3] +
       (float)local_98._24_4_ * local_58.l.vz.field_0.m128[3];
  *(pointer *)(pcVar2 + 0x90) = local_68._M_p;
  *(undefined1 (*) [8])(pcVar2 + 0x98) = auStack_60;
  (this->path).filename._M_dataplus._M_p = pcVar2;
  LOCK();
  *(long *)(pcVar2 + 8) = *(long *)(pcVar2 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadDirectionalLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa E = load<Vec3fa>(xml->child("E"));
    const Vec3fa D = Vec3fa(0,0,1);
    const SceneGraph::DirectionalLight light = SceneGraph::DirectionalLight(D,E);
    return new SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>(light.transform(space));
  }